

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::_icmd_ipban<3361>::run(char *ipname)

{
  char *ipname_local;
  
  banlist::add((banlist *)ipbans,ipname);
  return;
}

Assistant:

void sendkickbanlist(int cn)
    {
        string buf;
        vector<char> msgbuf;
        ipmask im;
        im.mask = ~0;
        int n;
        sendf(cn, 1, "ris", N_SERVMSG, bannedips.empty() ? "kick/ban list is empty" : "kick/ban list:");
        loopv(bannedips)
        {
            msgbuf.setsize(0);
            im.ip = bannedips[i].ip;
            n = sprintf(buf, "\f2id:\f7%2d\f2, ip: \f7", i);
            msgbuf.put(buf, n);
            n = im.print(buf);
            msgbuf.put(buf, n);
            n = sprintf(buf, "\f2, expires in: \f7");
            msgbuf.put(buf, n);
            formatsecs(msgbuf, (uint)((bannedips[i].expire-totalmillis)/1000));
            if(bannedips[i].reason)
            {
                n = snprintf(buf, sizeof(buf), "\f2, reason: \f7%s", bannedips[i].reason);
                msgbuf.put(buf, clamp(n, 0, int(sizeof(buf)-1)));
            }
            msgbuf.add(0);
            sendf(cn, 1, "ris", N_SERVMSG, msgbuf.getbuf());
        }
    }